

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.cpp
# Opt level: O3

BSDF * __thiscall
pbrt::SurfaceInteraction::GetBSDF
          (BSDF *__return_storage_ptr__,SurfaceInteraction *this,RayDifferential *ray,
          SampledWavelengths *lambda,CameraHandle *camera,ScratchBuffer *scratchBuffer,
          SamplerHandle *sampler)

{
  Vector3f *woRender;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar11;
  Tuple2<pbrt::Point2,_float> TVar10;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ushort uVar18;
  Normal3f dndvs;
  Vector3f dpdus;
  undefined1 auVar19 [16];
  Point3fi *pPVar20;
  Point3fi *pPVar21;
  BSDF *pBVar22;
  ulong uVar23;
  undefined1 (*pauVar24) [16];
  int iVar25;
  uint uVar26;
  ulong *puVar27;
  uint uVar28;
  uintptr_t uVar29;
  ulong uVar30;
  HaltonSampler *this_00;
  DebugMLTSampler *this_01;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined4 extraout_XMM0_Db;
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar36 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar40 [56];
  undefined1 auVar39 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined8 uVar43;
  undefined1 auVar44 [16];
  float fVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  SampledSpectrum SVar49;
  Normal3f ns;
  Vector3f dpdvs;
  Normal3f dndus;
  span<const_float> uc;
  span<const_pbrt::Point2<float>_> u;
  DispatchSplit<5> local_1aa;
  undefined1 local_1a9;
  undefined1 local_1a8 [16];
  anon_struct_60_5_be74bf41_for_shading *local_198;
  Normal3f *local_190;
  ScratchBuffer *local_188;
  BSDF *local_180;
  float local_178;
  float fStack_174;
  undefined1 *puStack_170;
  BumpEvalContext *pBStack_168;
  undefined8 uStack_160;
  ulong local_158;
  uint local_150;
  undefined4 uStack_14c;
  undefined4 local_148;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  BxDFHandle local_128;
  undefined8 local_120;
  float fStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  float fStack_10c;
  undefined8 uStack_108;
  float fStack_100;
  float fStack_fc;
  float fStack_f8;
  undefined4 uStack_f4;
  undefined8 uStack_f0;
  undefined4 uStack_e8;
  int iStack_e4;
  undefined8 local_e0;
  float local_d8;
  undefined4 local_d4;
  undefined4 uStack_d0;
  float local_cc;
  undefined8 local_c8;
  float local_c0;
  undefined4 local_bc;
  undefined4 uStack_b8;
  float local_b4;
  BumpEvalContext local_b0;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  local_140.bits =
       (camera->
       super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
       ).bits;
  local_1a8._8_8_ = local_1a8._0_8_;
  local_1a8._0_8_ = lambda;
  uVar23 = (sampler->
           super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
           ).bits;
  uVar28 = (uint)(ushort)(uVar23 >> 0x30);
  if (uVar23 >> 0x30 < 5) {
    if (uVar28 < 3) {
      iVar25 = *(int *)(uVar23 & 0xffffffffffff);
      if (uVar28 == 2) {
        iVar25 = iVar25 * ((int *)(uVar23 & 0xffffffffffff))[1];
      }
    }
    else {
LAB_004d8a40:
      iVar25 = *(int *)(uVar23 & 0xffffffffffff);
    }
  }
  else {
    if ((2 < uVar28 - 4) || (uVar28 - 4 != 2)) goto LAB_004d8a40;
    iVar25 = 1 << (*(byte *)((uVar23 & 0xffffffffffff) + 4) & 0x1f);
  }
  local_188 = scratchBuffer;
  local_180 = __return_storage_ptr__;
  ComputeDifferentials(this,ray,(CameraHandle *)&local_140,iVar25);
  uVar29 = (this->material).
           super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
           .bits;
  if ((short)(uVar29 >> 0x30) == 0xb) {
    local_190 = (Normal3f *)&this->dpdx;
    local_198 = (anon_struct_60_5_be74bf41_for_shading *)&this->dpdy;
    do {
      pPVar20 = &(this->super_Interaction).pi;
      pPVar21 = &(this->super_Interaction).pi;
      auVar31._0_4_ =
           (pPVar20->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
      auVar31._4_4_ =
           (pPVar20->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high
      ;
      auVar31._8_4_ =
           (pPVar21->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
      auVar31._12_4_ =
           (pPVar21->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high
      ;
      uVar43 = *(undefined8 *)
                &(this->super_Interaction).pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
      auVar31 = vinsertps_avx(auVar31,ZEXT416((uint)(this->super_Interaction).pi.
                                                    super_Point3<pbrt::Interval>.
                                                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                                                    high),0x10);
      auVar33._0_4_ = (float)uVar43 + auVar31._0_4_;
      auVar33._4_4_ = (float)((ulong)uVar43 >> 0x20) + auVar31._4_4_;
      auVar33._8_4_ = auVar31._8_4_ + 0.0;
      auVar33._12_4_ = auVar31._12_4_ + 0.0;
      auVar16._8_4_ = 0x3f000000;
      auVar16._0_8_ = 0x3f0000003f000000;
      auVar16._12_4_ = 0x3f000000;
      auVar31 = vmulps_avx512vl(auVar33,auVar16);
      fStack_118 = ((this->super_Interaction).pi.super_Point3<pbrt::Interval>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
                   (this->super_Interaction).pi.super_Point3<pbrt::Interval>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
      local_120 = vmovlps_avx(auVar31);
      fStack_10c = ((Tuple3<pbrt::Vector3,_float> *)&local_190->super_Tuple3<pbrt::Normal3,_float>)
                   ->z;
      uVar5 = (local_190->super_Tuple3<pbrt::Normal3,_float>).x;
      uVar11 = (local_190->super_Tuple3<pbrt::Normal3,_float>).y;
      fStack_100 = ((Tuple3<pbrt::Vector3,_float> *)&local_198->n)->z;
      uStack_108._0_4_ = (local_198->n).super_Tuple3<pbrt::Normal3,_float>.x;
      uStack_108._4_4_ = (local_198->n).super_Tuple3<pbrt::Normal3,_float>.y;
      TVar10 = (this->super_Interaction).uv.super_Tuple2<pbrt::Point2,_float>;
      fStack_fc = TVar10.x;
      fStack_f8 = TVar10.y;
      auVar32._0_4_ = this->dudx;
      auVar32._4_4_ = this->dvdx;
      auVar32._8_4_ = this->dudy;
      auVar32._12_4_ = this->dvdy;
      auVar31 = vpermilps_avx(auVar32,0xd8);
      uStack_f4 = auVar31._0_4_;
      uStack_f0 = auVar31._4_8_;
      uStack_e8 = auVar31._12_4_;
      iStack_e4 = this->faceIndex;
      local_d8 = (this->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z;
      local_e0._0_4_ = (this->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.x;
      local_e0._4_4_ = (this->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.y;
      local_cc = (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
      uVar6 = (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
      uVar12 = (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
      local_c0 = (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
      local_c8._0_4_ = (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
      local_c8._4_4_ = (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
      local_b4 = (this->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.z;
      uVar7 = (this->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.x;
      uVar13 = (this->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.y;
      uStack_114 = uVar5;
      uStack_110 = uVar11;
      local_d4 = uVar6;
      uStack_d0 = uVar12;
      local_bc = uVar7;
      uStack_b8 = uVar13;
      MixMaterial::ChooseMaterial<pbrt::UniversalTextureEvaluator>
                ((MixMaterial *)&local_b0,uVar29 & 0xffffffffffff);
      (this->material).
      super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
      .bits = local_b0.p.super_Tuple3<pbrt::Point3,_float>._0_8_;
      uVar29 = local_b0.p.super_Tuple3<pbrt::Point3,_float>._0_8_;
    } while ((local_b0.p.super_Tuple3<pbrt::Point3,_float>._0_8_ & 0xffff000000000000) ==
             0xb000000000000);
  }
  pBVar22 = local_180;
  puVar27 = (ulong *)(uVar29 & 0xffffffffffff);
  if (puVar27 == (ulong *)0x0) {
    (local_180->bxdf).
    super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
    .bits = 0;
    (pBVar22->ng).super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
    (pBVar22->ng).super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
    *(undefined8 *)&(local_180->ng).super_Tuple3<pbrt::Normal3,_float>.z = 0;
    (pBVar22->shadingFrame).x.super_Tuple3<pbrt::Vector3,_float>.x = 1.0;
    (pBVar22->shadingFrame).x.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
    *(undefined8 *)&(local_180->shadingFrame).x.super_Tuple3<pbrt::Vector3,_float>.z = 0;
    (pBVar22->shadingFrame).y.super_Tuple3<pbrt::Vector3,_float>.y = 1.0;
    (pBVar22->shadingFrame).y.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
    (pBVar22->shadingFrame).z.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
    (pBVar22->shadingFrame).z.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
    (local_180->shadingFrame).z.super_Tuple3<pbrt::Vector3,_float>.z = 1.0;
    return local_180;
  }
  uVar18 = (ushort)(uVar29 >> 0x30);
  if ((uint)(uVar29 >> 0x31) < 3) {
LAB_004d8c95:
    uVar23 = *puVar27;
LAB_004d8c98:
    uVar30 = puVar27[1];
  }
  else {
    if (3 < uVar18 - 5) {
      if (2 < uVar18 - 8) {
        LogFatal(Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/materials.h"
                 ,0x132,"Shouldn\'t be called");
      }
      goto LAB_004d8c95;
    }
    uVar30 = 0;
    uVar23 = 0;
    if (uVar18 - 5 != 2) {
      uVar23 = *puVar27;
      if (uVar18 == 7) {
        uVar30 = 0;
        goto LAB_004d8c9c;
      }
      goto LAB_004d8c98;
    }
  }
LAB_004d8c9c:
  if (((uVar23 & 0xffffffffffff) != 0) || (uVar30 != 0)) {
    local_178 = 0.0;
    fStack_174 = 0.0;
    local_150 = 0;
    uStack_14c = 0;
    puStack_170._0_4_ = 0.0;
    local_148 = 0;
    local_158 = uVar23;
    BumpEvalContext::BumpEvalContext(&local_b0,this);
    Bump<pbrt::UniversalTextureEvaluator>(&local_158,uVar30,&local_b0,&local_178,&local_150);
    auVar41._4_4_ = local_148;
    auVar41._0_4_ = uStack_14c;
    auVar41._8_8_ = 0;
    auVar44._4_4_ = fStack_174;
    auVar44._0_4_ = local_178;
    auVar44._8_8_ = 0;
    dpdus.super_Tuple3<pbrt::Vector3,_float>.y = fStack_174;
    dpdus.super_Tuple3<pbrt::Vector3,_float>.x = local_178;
    dpdus.super_Tuple3<pbrt::Vector3,_float>.z = puStack_170._0_4_;
    auVar46._4_4_ = puStack_170._0_4_;
    auVar46._0_4_ = fStack_174;
    auVar46._8_8_ = 0;
    dpdvs.super_Tuple3<pbrt::Vector3,_float>.y = (float)uStack_14c;
    dpdvs.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_150;
    auVar32 = vmovshdup_avx(auVar41);
    auVar31 = vinsertps_avx(ZEXT416(local_150),auVar41,0x1c);
    dpdvs.super_Tuple3<pbrt::Vector3,_float>.z = auVar32._0_4_;
    auVar16 = vfmsub213ss_fma(ZEXT416(local_150),ZEXT416((uint)puStack_170._0_4_),
                              ZEXT416((uint)(dpdvs.super_Tuple3<pbrt::Vector3,_float>.z * local_178)
                                     ));
    auVar33 = vfnmadd213ss_fma(auVar32,auVar44,
                               ZEXT416((uint)(dpdvs.super_Tuple3<pbrt::Vector3,_float>.z * local_178
                                             )));
    auVar47._0_4_ = auVar31._0_4_ * fStack_174;
    auVar47._4_4_ = auVar31._4_4_ * puStack_170._0_4_;
    auVar47._8_4_ = auVar31._8_4_ * 0.0;
    auVar47._12_4_ = auVar31._12_4_ * 0.0;
    auVar32 = vfmsub213ps_fma(auVar41,auVar44,auVar47);
    auVar31 = vfnmadd213ps_fma(auVar31,auVar46,auVar47);
    fVar45 = auVar33._0_4_ + auVar16._0_4_;
    auVar42._0_4_ = auVar31._0_4_ + auVar32._0_4_;
    auVar42._4_4_ = auVar31._4_4_ + auVar32._4_4_;
    auVar42._8_4_ = auVar31._8_4_ + auVar32._8_4_;
    auVar42._12_4_ = auVar31._12_4_ + auVar32._12_4_;
    auVar48._0_4_ = auVar42._0_4_ * auVar42._0_4_;
    auVar48._4_4_ = auVar42._4_4_ * auVar42._4_4_;
    auVar48._8_4_ = auVar42._8_4_ * auVar42._8_4_;
    auVar48._12_4_ = auVar42._12_4_ * auVar42._12_4_;
    auVar31 = vmovshdup_avx(auVar48);
    auVar31 = ZEXT416((uint)(auVar48._0_4_ + auVar31._0_4_ + fVar45 * fVar45));
    auVar31 = vsqrtss_avx(auVar31,auVar31);
    auVar32 = vpermi2ps_avx512vl(_DAT_0054e620,auVar42,ZEXT416((uint)fVar45));
    fVar45 = auVar31._0_4_;
    auVar34._4_4_ = fVar45;
    auVar34._0_4_ = fVar45;
    auVar34._8_4_ = fVar45;
    auVar34._12_4_ = fVar45;
    ns.super_Tuple3<pbrt::Normal3,_float>.z = auVar42._0_4_ / fVar45;
    uVar1 = (this->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.x;
    uVar2 = (this->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.y;
    dndus.super_Tuple3<pbrt::Normal3,_float>.y = (float)uVar2;
    dndus.super_Tuple3<pbrt::Normal3,_float>.x = (float)uVar1;
    auVar31 = vdivps_avx(auVar32,auVar34);
    uVar8 = (this->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.x;
    uVar14 = (this->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.y;
    dndvs.super_Tuple3<pbrt::Normal3,_float>.y = (float)uVar14;
    dndvs.super_Tuple3<pbrt::Normal3,_float>.x = (float)uVar8;
    dndvs.super_Tuple3<pbrt::Normal3,_float>.z =
         (this->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.z;
    ns.super_Tuple3<pbrt::Normal3,_float>._0_8_ = auVar31._0_8_;
    dndus.super_Tuple3<pbrt::Normal3,_float>.z =
         (this->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.z;
    SetShadingGeometry(this,ns,dpdus,dpdvs,dndus,dndvs,false);
    uVar29 = (this->material).
             super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
             .bits;
  }
  pPVar20 = &(this->super_Interaction).pi;
  pPVar21 = &(this->super_Interaction).pi;
  auVar3._0_4_ = (pPVar20->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                 x.low;
  auVar3._4_4_ = (pPVar20->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                 x.high;
  auVar3._8_4_ = (pPVar21->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                 y.low;
  auVar3._12_4_ =
       (pPVar21->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
  uVar43 = *(undefined8 *)
            &(this->super_Interaction).pi.super_Point3<pbrt::Interval>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  local_b0.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.x =
       (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  pBStack_168 = &local_b0;
  auVar31 = vinsertps_avx(auVar3,ZEXT416((uint)(this->super_Interaction).pi.
                                               super_Point3<pbrt::Interval>.
                                               super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),
                          0x10);
  auVar35._0_4_ = (float)uVar43 + auVar31._0_4_;
  auVar35._4_4_ = (float)((ulong)uVar43 >> 0x20) + auVar31._4_4_;
  auVar35._8_4_ = auVar31._8_4_ + 0.0;
  auVar35._12_4_ = auVar31._12_4_ + 0.0;
  auVar17._8_4_ = 0x3f000000;
  auVar17._0_8_ = 0x3f0000003f000000;
  auVar17._12_4_ = 0x3f000000;
  auVar31 = vmulps_avx512vl(auVar35,auVar17);
  local_b0.shading.n.super_Tuple3<pbrt::Normal3,_float>.y =
       (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  local_b0.shading.n.super_Tuple3<pbrt::Normal3,_float>.z =
       (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  local_b0.p.super_Tuple3<pbrt::Point3,_float>.z =
       ((this->super_Interaction).pi.super_Point3<pbrt::Interval>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
       (this->super_Interaction).pi.super_Point3<pbrt::Interval>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
  local_b0.shading.dndv.super_Tuple3<pbrt::Normal3,_float>.y =
       (this->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z;
  TVar10 = (this->super_Interaction).uv.super_Tuple2<pbrt::Point2,_float>;
  local_b0.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.y = (float)this->faceIndex;
  local_b0.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.z =
       (this->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.x;
  local_b0.shading.dndv.super_Tuple3<pbrt::Normal3,_float>.x =
       (this->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.y;
  local_b0.dpdx.super_Tuple3<pbrt::Vector3,_float>.x =
       (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
  local_b0.dvdx = (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
  local_b0.dvdy = (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
  local_b0.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar31);
  local_b0.shading.n.super_Tuple3<pbrt::Normal3,_float>.x =
       (this->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  uVar9 = (this->dpdx).super_Tuple3<pbrt::Vector3,_float>.x;
  uVar15 = (this->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  local_b0.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.y = TVar10.x;
  local_b0.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.z = TVar10.y;
  auVar4._0_4_ = this->dudx;
  auVar4._4_4_ = this->dvdx;
  auVar4._8_4_ = this->dudy;
  auVar4._12_4_ = this->dvdy;
  auVar31 = vpermilps_avx(auVar4,0xd8);
  local_b0.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.x = auVar31._0_4_;
  local_b0.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>._4_8_ = auVar31._4_8_;
  local_b0.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.x = auVar31._12_4_;
  puStack_170 = &local_1a9;
  local_b0.shading.dndv.super_Tuple3<pbrt::Normal3,_float>.z =
       (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
  local_b0.dudx = (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
  local_b0.dudy = (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
  local_b0.dpdx.super_Tuple3<pbrt::Vector3,_float>.y =
       (this->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.x;
  local_b0.dpdx.super_Tuple3<pbrt::Vector3,_float>.z =
       (this->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.y;
  local_b0.dpdy.super_Tuple3<pbrt::Vector3,_float>.x =
       (this->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.z;
  local_178 = SUB84(local_188,0);
  fStack_174 = (float)((ulong)local_188 >> 0x20);
  uStack_160 = local_1a8._0_8_;
  local_150 = (uint)uVar29;
  uStack_14c = (undefined4)(uVar29 >> 0x20);
  local_b0.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)uVar9;
  local_b0.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)uVar15;
  if (uVar29 < 0x6000000000000) {
    uVar43 = 0;
    DispatchSplit<5>::operator()(pBVar22,&local_1aa);
  }
  else {
    uVar43 = 0;
    DispatchSplit<6>::operator()
              (pBVar22,(DispatchSplit<6> *)&local_1aa,&local_150,(ushort)(uVar29 >> 0x30) - 5,
               local_188,0x6000000000000,local_188,puStack_170._0_4_,pBStack_168,local_1a8._0_8_);
  }
  if (((pBVar22->bxdf).
       super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
       .bits & 0xffffffffffff) == 0) {
    return pBVar22;
  }
  if (*(char *)(Options + 7) != '\x01') {
    return pBVar22;
  }
  local_190 = &(this->super_Interaction).n;
  woRender = &(this->super_Interaction).wo;
  local_198 = &this->shading;
  local_b0.p.super_Tuple3<pbrt::Point3,_float>._0_8_ =
       (sampler->
       super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
       ).bits;
  local_178 = DispatchSplit<9>::operator()
                        ((DispatchSplit<9> *)&local_178,&local_b0,
                         (ulong)local_b0.p.super_Tuple3<pbrt::Point3,_float>._0_8_ >> 0x30);
  uVar23 = (sampler->
           super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
           ).bits;
  uVar18 = (ushort)(uVar23 >> 0x30);
  uVar28 = (uint)uVar18;
  if (uVar23 < 0x5000000000000) {
    if (uVar28 < 3) {
      if (uVar28 == 2) {
        auVar38._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)(uVar23 & 0xffffffffffff));
        auVar38._8_56_ = extraout_var_01;
      }
      else {
        auVar38._0_8_ = RandomSampler::Get2D((RandomSampler *)(uVar23 & 0xffffffffffff));
        auVar38._8_56_ = extraout_var_04;
      }
      goto LAB_004d90cb;
    }
    this_00 = (HaltonSampler *)(uVar23 & 0xffffffffffff);
    if ((uVar28 & 6) != 2) {
      auVar38._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)this_00);
      auVar38._8_56_ = extraout_var_06;
      goto LAB_004d90cb;
    }
    iVar25 = 2;
    if (this_00->dimension < 999) {
      iVar25 = this_00->dimension;
    }
    this_00->dimension = iVar25 + 2;
    local_1a8._0_4_ = HaltonSampler::SampleDimension(this_00,iVar25);
    local_1a8._4_4_ = extraout_XMM0_Db;
    local_1a8._8_4_ = extraout_XMM0_Dc;
    local_1a8._12_4_ = extraout_XMM0_Dd;
    auVar36._0_4_ = HaltonSampler::SampleDimension(this_00,iVar25 + 1);
    auVar36._4_60_ = extraout_var;
    auVar31 = auVar36._0_16_;
  }
  else {
    uVar26 = uVar18 - 4;
    if (uVar26 < 3) {
      if (uVar26 == 2) {
        auVar38._0_8_ = ZSobolSampler::Get2D((ZSobolSampler *)(uVar23 & 0xffffffffffff));
        auVar38._8_56_ = extraout_var_02;
      }
      else {
        auVar38._0_8_ = SobolSampler::Get2D((SobolSampler *)(uVar23 & 0xffffffffffff));
        auVar38._8_56_ = extraout_var_05;
      }
      goto LAB_004d90cb;
    }
    this_01 = (DebugMLTSampler *)(uVar23 & 0xffffffffffff);
    if (uVar28 - 6 < 2) {
      auVar38._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)this_01);
      auVar38._8_56_ = extraout_var_03;
      goto LAB_004d90cb;
    }
    if (uVar28 - 6 == 2) {
      auVar38._0_8_ = MLTSampler::Get2D((MLTSampler *)this_01);
      auVar38._8_56_ = extraout_var_07;
      goto LAB_004d90cb;
    }
    local_1a8._0_4_ = DebugMLTSampler::Get1D(this_01);
    local_1a8._4_4_ = extraout_XMM0_Db_00;
    local_1a8._8_4_ = extraout_XMM0_Dc_00;
    local_1a8._12_4_ = extraout_XMM0_Dd_00;
    auVar37._0_4_ = DebugMLTSampler::Get1D(this_01);
    auVar37._4_60_ = extraout_var_00;
    auVar31 = auVar37._0_16_;
  }
  uVar43 = local_1a8._8_8_;
  auVar31 = vinsertps_avx(local_1a8,auVar31,0x10);
  auVar38 = ZEXT1664(auVar31);
LAB_004d90cb:
  auVar40 = auVar38._8_56_;
  local_b0.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar38._0_16_);
  uc.n = 1;
  uc.ptr = &local_178;
  u.n = 1;
  u.ptr = (Point2<float> *)&local_b0;
  SVar49 = BSDF::rho(pBVar22,woRender,uc,u);
  local_138 = SVar49.values.values._8_8_;
  auVar39._0_8_ = SVar49.values.values._0_8_;
  auVar39._8_56_ = auVar40;
  local_1a8 = auVar39._0_16_;
  uStack_130 = uVar43;
  pauVar24 = (undefined1 (*) [16])ScratchBuffer::Alloc(local_188,0x10,4);
  auVar19._8_8_ = uStack_130;
  auVar19._0_8_ = local_138;
  auVar31 = vunpcklpd_avx(local_1a8,auVar19);
  local_128.
  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
  .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
           )((ulong)pauVar24 | 0x1000000000000);
  *pauVar24 = auVar31;
  BSDF::BSDF((BSDF *)&local_b0,woRender,local_190,&local_198->n,&(this->shading).dpdu,&local_128);
  (pBVar22->bxdf).
  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
  .bits = local_b0.p.super_Tuple3<pbrt::Point3,_float>._0_8_;
  (pBVar22->ng).super_Tuple3<pbrt::Normal3,_float>.x =
       local_b0.p.super_Tuple3<pbrt::Point3,_float>.z;
  (pBVar22->ng).super_Tuple3<pbrt::Normal3,_float>.y =
       local_b0.uv.super_Tuple2<pbrt::Point2,_float>.x;
  *(ulong *)&(pBVar22->ng).super_Tuple3<pbrt::Normal3,_float>.z =
       CONCAT44(local_b0.shading.n.super_Tuple3<pbrt::Normal3,_float>.x,
                local_b0.uv.super_Tuple2<pbrt::Point2,_float>.y);
  (pBVar22->shadingFrame).x.super_Tuple3<pbrt::Vector3,_float>.y =
       local_b0.shading.n.super_Tuple3<pbrt::Normal3,_float>.y;
  (pBVar22->shadingFrame).x.super_Tuple3<pbrt::Vector3,_float>.z =
       local_b0.shading.n.super_Tuple3<pbrt::Normal3,_float>.z;
  (pBVar22->shadingFrame).y.super_Tuple3<pbrt::Vector3,_float>.x =
       local_b0.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.x;
  (pBVar22->shadingFrame).y.super_Tuple3<pbrt::Vector3,_float>.y =
       local_b0.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.y;
  (pBVar22->shadingFrame).x.super_Tuple3<pbrt::Vector3,_float>.y =
       local_b0.shading.n.super_Tuple3<pbrt::Normal3,_float>.y;
  (pBVar22->shadingFrame).x.super_Tuple3<pbrt::Vector3,_float>.z =
       local_b0.shading.n.super_Tuple3<pbrt::Normal3,_float>.z;
  (pBVar22->shadingFrame).y.super_Tuple3<pbrt::Vector3,_float>.x =
       local_b0.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.x;
  (pBVar22->shadingFrame).y.super_Tuple3<pbrt::Vector3,_float>.y =
       local_b0.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.y;
  *(ulong *)&(pBVar22->shadingFrame).y.super_Tuple3<pbrt::Vector3,_float>.z =
       CONCAT44(local_b0.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.x,
                local_b0.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.z);
  (pBVar22->shadingFrame).z.super_Tuple3<pbrt::Vector3,_float>.y =
       local_b0.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.y;
  (pBVar22->shadingFrame).z.super_Tuple3<pbrt::Vector3,_float>.z =
       local_b0.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.z;
  return pBVar22;
}

Assistant:

BSDF SurfaceInteraction::GetBSDF(const RayDifferential &ray, SampledWavelengths &lambda,
                                 CameraHandle camera, ScratchBuffer &scratchBuffer,
                                 SamplerHandle sampler) {
    ComputeDifferentials(ray, camera, sampler.SamplesPerPixel());
    // Resolve _MixMaterial_ if necessary
    while (material.Is<MixMaterial>()) {
        MixMaterial *mix = material.CastOrNullptr<MixMaterial>();
        material = mix->ChooseMaterial(UniversalTextureEvaluator(), *this);
    }

    // Return unset _BSDF_ if surface has a null material
    if (!material)
        return {};

    // Evaluate bump map and compute shading normal
    FloatTextureHandle displacement = material.GetDisplacement();
    const Image *normalMap = material.GetNormalMap();
    if (displacement || normalMap) {
        Vector3f dpdu, dpdv;
        Bump(UniversalTextureEvaluator(), displacement, normalMap, *this, &dpdu, &dpdv);
        SetShadingGeometry(Normal3f(Normalize(Cross(dpdu, dpdv))), dpdu, dpdv,
                           shading.dndu, shading.dndv, false);
    }

    // Return BSDF for surface interaction
    BSDF bsdf =
        material.GetBSDF(UniversalTextureEvaluator(), *this, lambda, scratchBuffer);
    if (bsdf && GetOptions().forceDiffuse) {
        // Override _bsdf_ with diffuse equivalent
        SampledSpectrum r = bsdf.rho(wo, {sampler.Get1D()}, {sampler.Get2D()});
        bsdf = BSDF(wo, n, shading.n, shading.dpdu,
                    scratchBuffer.Alloc<IdealDiffuseBxDF>(r));
    }
    return bsdf;
}